

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.hpp
# Opt level: O0

double units::convert<units::unit,units::precise_unit>(double val,unit *start,precise_unit *result)

{
  unit *puVar1;
  bool bVar2;
  uint uVar3;
  precise_unit *extraout_RDX;
  precise_unit *extraout_RDX_00;
  precise_unit *extraout_RDX_01;
  precise_unit *ppVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  bool local_f1;
  bool local_b1;
  double converted_val_3;
  double local_a0;
  double converted_val_2;
  unit_data base_result;
  unit_data base_start;
  unit local_88;
  double local_80;
  double genBase;
  double local_70;
  double converted_val_1;
  unit local_60;
  unit_data local_58;
  unit_data local_54;
  unit_data local_50;
  unit_data local_4c;
  double local_48;
  double keyval;
  double local_38;
  double converted_val;
  precise_unit *local_28;
  precise_unit *result_local;
  unit *start_local;
  double val_local;
  
  local_28 = result;
  result_local = (precise_unit *)start;
  start_local = (unit *)val;
  bVar2 = operator==(start,result);
  if (((bVar2) || (bVar2 = is_default((unit *)result_local), bVar2)) ||
     (bVar2 = is_default(local_28), bVar2)) {
    return (double)start_local;
  }
  bVar2 = unit::has_e_flag((unit *)result_local);
  if (!bVar2) {
    bVar2 = precise_unit::has_e_flag(local_28);
    local_b1 = false;
    if (!bVar2) goto LAB_00129ad8;
  }
  ppVar4 = result_local;
  converted_val._4_4_ = precise_unit::base_units(local_28);
  local_b1 = unit::has_same_base((unit *)ppVar4,(unit_data *)((long)&converted_val + 4));
LAB_00129ad8:
  if (local_b1 != false) {
    local_38 = detail::convertFlaggedUnits<units::unit,units::precise_unit>
                         ((double)start_local,(unit *)result_local,local_28,NAN);
    uVar3 = std::isnan(local_38);
    if ((uVar3 & 1) == 0) {
      return local_38;
    }
  }
  bVar2 = unit::is_equation((unit *)result_local);
  if ((bVar2) || (bVar2 = precise_unit::is_equation(local_28), bVar2)) {
    keyval._4_4_ = unit::base_units((unit *)result_local);
    keyval._0_4_ = precise_unit::base_units(local_28);
    bVar2 = detail::unit_data::equivalent_non_counting
                      ((unit_data *)((long)&keyval + 4),(unit_data *)&keyval);
    puVar1 = start_local;
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      local_4c = unit::base_units((unit *)result_local);
      dVar7 = precise::equations::convert_equnit_to_value((double)puVar1,&local_4c);
      local_48 = dVar7;
      dVar6 = unit::multiplier((unit *)result_local);
      dVar5 = precise_unit::multiplier(local_28);
      dVar5 = (dVar7 * dVar6) / dVar5;
      local_48 = dVar5;
      local_50 = precise_unit::base_units(local_28);
      val_local = precise::equations::convert_value_to_equnit(dVar5,&local_50);
    }
    else {
      val_local = NAN;
    }
  }
  else {
    local_54 = unit::base_units((unit *)result_local);
    local_58 = precise_unit::base_units(local_28);
    bVar2 = detail::unit_data::operator==(&local_54,&local_58);
    puVar1 = start_local;
    if (bVar2) {
      dVar7 = unit::multiplier((unit *)result_local);
      dVar6 = precise_unit::multiplier(local_28);
      val_local = ((double)puVar1 * dVar7) / dVar6;
    }
    else {
      bVar2 = unit::is_per_unit((unit *)result_local);
      if ((bVar2) && (bVar2 = precise_unit::is_per_unit(local_28), bVar2)) {
        local_60 = unit_cast((unit *)result_local);
        bVar2 = unit::operator==(&local_60,(unit *)&pu);
        local_f1 = true;
        if (!bVar2) {
          converted_val_1 = (double)unit_cast(local_28);
          local_f1 = unit::operator==((unit *)&converted_val_1,(unit *)&pu);
        }
        puVar1 = start_local;
        if (local_f1 != false) {
          return (double)start_local;
        }
        genBase._4_4_ = unit::base_units((unit *)result_local);
        genBase._0_4_ = precise_unit::base_units(local_28);
        local_70 = puconversion::knownConversions
                             ((double)puVar1,(unit_data *)((long)&genBase + 4),(unit_data *)&genBase
                             );
        uVar3 = std::isnan(local_70);
        if ((uVar3 & 1) == 0) {
          return local_70;
        }
      }
      else {
        bVar2 = unit::is_per_unit((unit *)result_local);
        if ((bVar2) || (bVar2 = precise_unit::is_per_unit(local_28), bVar2)) {
          local_88 = unit_cast((unit *)result_local);
          _base_result = unit_cast(local_28);
          local_80 = puconversion::assumedBase(&local_88,(unit *)&base_result);
          uVar3 = std::isnan(local_80);
          if ((uVar3 & 1) == 0) {
            dVar7 = convert<units::unit,units::precise_unit>
                              ((double)start_local,(unit *)result_local,local_28,local_80);
            return dVar7;
          }
          return NAN;
        }
      }
      converted_val_2._4_4_ = unit::base_units((unit *)result_local);
      converted_val_2._0_4_ = precise_unit::base_units(local_28);
      bVar2 = detail::unit_data::has_same_base
                        ((unit_data *)((long)&converted_val_2 + 4),(unit_data *)&converted_val_2);
      puVar1 = start_local;
      if (bVar2) {
        dVar7 = unit::multiplier((unit *)result_local);
        dVar6 = precise_unit::multiplier(local_28);
        val_local = ((double)puVar1 * dVar7) / dVar6;
      }
      else {
        bVar2 = detail::unit_data::equivalent_non_counting
                          ((unit_data *)((long)&converted_val_2 + 4),(unit_data *)&converted_val_2);
        if (bVar2) {
          local_a0 = detail::convertCountingUnits<units::unit,units::precise_unit>
                               ((double)start_local,(unit *)result_local,local_28);
          uVar3 = std::isnan(local_a0);
          if ((uVar3 & 1) == 0) {
            return local_a0;
          }
        }
        converted_val_3._4_4_ = detail::unit_data::inv((unit_data *)&converted_val_2);
        bVar2 = detail::unit_data::has_same_base
                          ((unit_data *)((long)&converted_val_2 + 4),
                           (unit_data *)((long)&converted_val_3 + 4));
        puVar1 = start_local;
        if (bVar2) {
          dVar7 = unit::multiplier((unit *)result_local);
          dVar6 = precise_unit::multiplier(local_28);
          val_local = 1.0 / ((double)puVar1 * dVar7 * dVar6);
        }
        else {
          bVar2 = unit::has_e_flag((unit *)result_local);
          ppVar4 = extraout_RDX;
          if ((bVar2) ||
             (bVar2 = precise_unit::has_e_flag(local_28), ppVar4 = extraout_RDX_00, bVar2)) {
            dVar7 = detail::extraValidConversions<units::unit,units::precise_unit>
                              ((detail *)result_local,(double)start_local,(unit *)local_28,ppVar4);
            uVar3 = std::isnan(dVar7);
            ppVar4 = extraout_RDX_01;
            if ((uVar3 & 1) == 0) {
              return dVar7;
            }
          }
          val_local = detail::otherUsefulConversions<units::unit,units::precise_unit>
                                ((detail *)result_local,(double)start_local,(unit *)local_28,ppVar4)
          ;
        }
      }
    }
  }
  return val_local;
}

Assistant:

double convert(double val, const UX& start, const UX2& result)
{
    static_assert(
        std::is_same<UX, unit>::value || std::is_same<UX, precise_unit>::value,
        "convert argument types must be unit or precise_unit");
    static_assert(
        std::is_same<UX2, unit>::value ||
            std::is_same<UX2, precise_unit>::value,
        "convert argument types must be unit or precise_unit");
    if (start == result || is_default(start) || is_default(result)) {
        return val;
    }
    if ((start.has_e_flag() || result.has_e_flag()) &&
        start.has_same_base(result.base_units())) {
        double converted_val = detail::convertFlaggedUnits(val, start, result);
        if (!std::isnan(converted_val)) {
            return converted_val;
        }
    }
    if (start.is_equation() || result.is_equation()) {
        if (!start.base_units().equivalent_non_counting(result.base_units())) {
            return constants::invalid_conversion;
        }
        double keyval = precise::equations::convert_equnit_to_value(
            val, start.base_units());
        keyval = keyval * start.multiplier() / result.multiplier();
        return precise::equations::convert_value_to_equnit(
            keyval, result.base_units());
    }
    if (start.base_units() == result.base_units()) {
        return val * start.multiplier() / result.multiplier();
    }
    // check if both are pu since this doesn't require knowing a base unit
    if (start.is_per_unit() &&
        result.is_per_unit()) {  // we know they have different unit basis
        if (unit_cast(start) == pu || unit_cast(result) == pu) {
            // generic pu just means the units are equivalent since the other is
            // puXX already
            return val;
        }
        double converted_val = puconversion::knownConversions(
            val, start.base_units(), result.base_units());
        if (!std::isnan(converted_val)) {
            return converted_val;
        }
    } else if (start.is_per_unit() || result.is_per_unit()) {
        double genBase =
            puconversion::assumedBase(unit_cast(start), unit_cast(result));
        if (!std::isnan(genBase)) {
            return convert(val, start, result, genBase);
        }
        // other assumptions for PU base are probably dangerous so shouldn't be
        // allowed
        return constants::invalid_conversion;
    }

    auto base_start = start.base_units();
    auto base_result = result.base_units();
    if (base_start.has_same_base(base_result)) {
        // ignore i flag and e flag, special cases have been dealt with already,
        // so those are just markers
        return val * start.multiplier() / result.multiplier();
    }
    // deal with some counting conversions
    if (base_start.equivalent_non_counting(base_result)) {
        double converted_val = detail::convertCountingUnits(val, start, result);
        if (!std::isnan(converted_val)) {
            return converted_val;
        }
    }
    // check for inverse units
    if (base_start.has_same_base(base_result.inv())) {
        // ignore flag and e flag  special cases have been dealt with already,
        // so those are just markers
        return 1.0 / (val * start.multiplier() * result.multiplier());
    }
    if (start.has_e_flag() || result.has_e_flag()) {
        double converted_val =
            detail::extraValidConversions(val, start, result);
        if (!std::isnan(converted_val)) {
            return converted_val;
        }
    }
    // this is the last chance and will return invalid_result if it doesn't find
    // a match
    return detail::otherUsefulConversions(val, start, result);
}